

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O0

uchar lua_sj_get_byte(uint address)

{
  uchar uVar1;
  int to_remove;
  uchar result;
  int positionsAdded;
  uint address_local;
  
  to_remove = addLuaSourcePositions();
  uVar1 = MemGetByte(address);
  removeLuaSourcePositions(to_remove);
  return uVar1;
}

Assistant:

static unsigned char lua_sj_get_byte(unsigned int address) {
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	auto result = MemGetByte(address);
	removeLuaSourcePositions(positionsAdded);
	return result;
}